

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::GetAllTestDependencies
          (cmCTestMultiProcessHandler *this,int test,TestList *dependencies)

{
  iterator __position;
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  int i;
  _Rb_tree_color local_30;
  int local_2c;
  
  local_2c = test;
  pmVar1 = std::
           map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
           ::operator[](&(this->PendingTests).
                         super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                        ,&local_2c);
  p_Var2 = (pmVar1->Depends).super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
           super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pmVar1->Depends).super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
            super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_30 = p_Var2[1]._M_color;
      GetAllTestDependencies(this,local_30,dependencies);
      __position._M_current =
           (dependencies->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (dependencies->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)dependencies,__position,(int *)&local_30);
      }
      else {
        *__position._M_current = local_30;
        (dependencies->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             __position._M_current + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::GetAllTestDependencies(int test,
                                                        TestList& dependencies)
{
  TestSet const& dependencySet = this->PendingTests[test].Depends;
  for (int i : dependencySet) {
    this->GetAllTestDependencies(i, dependencies);
    dependencies.push_back(i);
  }
}